

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_shaders.cpp
# Opt level: O0

void gen_WARD_anisotropic_phong_shade
               (float *cl,float *cp,float *l,float *e,float *n,float pu,float pv,float y,
               float *clambert)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float local_8c;
  float local_88;
  float local_84 [2];
  vec3 kspec;
  vec3 u;
  vec3 y_v;
  vec3 v;
  vec3 h;
  float *clambert_local;
  float y_local;
  float pv_local;
  float pu_local;
  float *n_local;
  float *e_local;
  float *l_local;
  float *cp_local;
  float *cl_local;
  
  vec3_add(v + 1,e,l);
  vec3_norm(v + 1,v + 1);
  u[1] = 0.0;
  y_v[0] = 0.0;
  u[2] = y;
  fVar2 = vec3_mul_inner(n,u + 1);
  vec3_scale(y_v + 1,n,fVar2);
  vec3_sub(y_v + 1,u + 1,y_v + 1);
  vec3_norm(y_v + 1,y_v + 1);
  vec3_mul_cross(kspec + 1,y_v + 1,n);
  vec3_norm(kspec + 1,kspec + 1);
  local_88 = 0.0;
  fVar2 = vec3_mul_inner(n,l);
  fVar3 = vec3_mul_inner(n,l);
  local_8c = vec3_mul_inner(n,e);
  local_8c = (fVar2 / fVar3) * local_8c;
  pfVar1 = std::max<float>(&local_88,&local_8c);
  dVar5 = std::sqrt((double)(ulong)(uint)*pfVar1);
  vec3_scale(local_84,cp,SUB84(dVar5,0));
  vec3_scale(local_84,local_84,1.0 / (pu * 12.566371 * pv));
  fVar2 = vec3_mul_inner(v + 1,kspec + 1);
  fVar2 = sqr(fVar2 / pu);
  fVar3 = vec3_mul_inner(v + 1,y_v + 1);
  fVar3 = sqr(fVar3 / pv);
  fVar4 = vec3_mul_inner(v + 1,n);
  dVar5 = std::exp((double)(ulong)(uint)(((fVar2 + fVar3) * -2.0) / (fVar4 + 1.0)));
  vec3_scale(local_84,local_84,SUB84(dVar5,0));
  vec3_fraction(local_84,local_84,cl);
  vec3_add(clambert,clambert,local_84);
  vec3_cull(clambert);
  return;
}

Assistant:

void gen_WARD_anisotropic_phong_shade(const vec3 cl, const vec3 cp, const vec3 l, const vec3 e, const vec3 n, const float pu, const float pv, const float y, vec3 clambert){
    //calculate h
    vec3 h;
    vec3_add(h, e, l);
    vec3_norm(h,h);

    //calculate u and v unit vector
    vec3 v;
    vec3 y_v = {0.0f, y, 0.0f};
    vec3_scale(v, n, vec3_mul_inner(n,y_v));
    vec3_sub(v, y_v, v);
    vec3_norm(v,v);
    vec3 u;
    vec3_mul_cross(u, v, n);
    vec3_norm(u,u);
    
    //calculate kspecular
    vec3 kspec;
    vec3_scale(kspec, cp, sqrt( std::max(0.0f, vec3_mul_inner(n,l) / vec3_mul_inner(n,l)*vec3_mul_inner(n,e)) )); //first term of the multiplication
    vec3_scale(kspec, kspec, 1.0f / (4.0f*PI*pu*pv) ); //second term
    vec3_scale(kspec, kspec, exp( -2.0f * (sqr(vec3_mul_inner(h,u)/pu) + sqr(vec3_mul_inner(h,v)/pv)) / (1.0f+vec3_mul_inner(h,n)) ) ); //thrid term
    vec3_fraction(kspec, kspec, cl); //control one more time by light color

    //add specular to lambertian shade
    vec3_add(clambert, clambert, kspec);
    vec3_cull(clambert);
}